

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronPtr xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)

{
  bool bVar1;
  int iVar2;
  xmlNodePtr node;
  xmlChar *pxVar3;
  _xmlNode *p_Var4;
  xmlChar *ns_uri;
  bool bVar5;
  xmlChar *uri;
  xmlChar *prefix;
  xmlChar *title;
  _xmlNode *p_Stack_38;
  int preserve;
  xmlNodePtr cur;
  xmlNodePtr root;
  xmlDocPtr doc;
  xmlSchematronPtr ret;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  doc = (xmlDocPtr)0x0;
  bVar1 = false;
  if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
    ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
  }
  else {
    ctxt->nberrors = 0;
    if (ctxt->URL == (xmlChar *)0x0) {
      if (ctxt->buffer == (char *)0x0) {
        if (ctxt->doc == (xmlDocPtr)0x0) {
          xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,0x6de,"xmlSchematronParse: could not parse.\n",
                            (xmlChar *)0x0,(xmlChar *)0x0);
          return (xmlSchematronPtr)0x0;
        }
        root = (xmlNodePtr)ctxt->doc;
        bVar1 = true;
        ctxt->preserve = 1;
      }
      else {
        root = (xmlNodePtr)xmlReadMemory(ctxt->buffer,ctxt->size,(char *)0x0,(char *)0x0,2);
        if ((xmlDocPtr)root == (xmlDocPtr)0x0) {
          xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,0x6e6,"xmlSchematronParse: could not parse.\n",
                            (xmlChar *)0x0,(xmlChar *)0x0);
          return (xmlSchematronPtr)0x0;
        }
        pxVar3 = xmlStrdup((xmlChar *)"in_memory_buffer");
        ((xmlDocPtr)root)->URL = pxVar3;
        pxVar3 = xmlDictLookup(ctxt->dict,(xmlChar *)"in_memory_buffer",-1);
        ctxt->URL = pxVar3;
        ctxt->preserve = 0;
      }
    }
    else {
      root = (xmlNodePtr)xmlReadFile((char *)ctxt->URL,(char *)0x0,2);
      if ((xmlDocPtr)root == (xmlDocPtr)0x0) {
        xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,0x6dd,"xmlSchematronParse: could not load \'%s\'.\n",
                          ctxt->URL,(xmlChar *)0x0);
        return (xmlSchematronPtr)0x0;
      }
      ctxt->preserve = 0;
    }
    node = xmlDocGetRootElement((xmlDoc *)root);
    if (node == (xmlNodePtr)0x0) {
      xmlSchematronPErr(ctxt,root,0x6df,"The schema has no document element.\n",(xmlChar *)0x0,
                        (xmlChar *)0x0);
      if (!bVar1) {
        xmlFreeDoc((xmlDocPtr)root);
      }
      ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
    }
    else {
      if (((((node == (xmlNodePtr)0x0) || (node->type != XML_ELEMENT_NODE)) ||
           (node->ns == (xmlNs *)0x0)) || (iVar2 = xmlStrEqual(node->name,"schema"), iVar2 == 0)) ||
         ((iVar2 = xmlStrEqual(node->ns->href,xmlSchematronNs), iVar2 == 0 &&
          (iVar2 = xmlStrEqual(node->ns->href,xmlOldSchematronNs), iVar2 == 0)))) {
        xmlSchematronPErr(ctxt,node,0x6df,"The XML document \'%s\' is not a XML schematron document"
                          ,ctxt->URL,(xmlChar *)0x0);
      }
      else {
        doc = (xmlDocPtr)xmlSchematronNewSchematron(ctxt);
        if (doc != (xmlDocPtr)0x0) {
          ctxt->schema = (xmlSchematronPtr)doc;
          p_Stack_38 = node->children;
          while ((p_Stack_38 != (xmlNode *)0x0 &&
                 (((p_Stack_38->type != XML_ELEMENT_NODE || (p_Stack_38->ns == (xmlNs *)0x0)) ||
                  ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 == 0 &&
                   (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 == 0)))))))
          {
            p_Stack_38 = p_Stack_38->next;
          }
          if ((((p_Stack_38 != (xmlNode *)0x0) && (p_Stack_38->type == XML_ELEMENT_NODE)) &&
              (p_Stack_38->ns != (xmlNs *)0x0)) &&
             ((iVar2 = xmlStrEqual(p_Stack_38->name,(xmlChar *)"title"), iVar2 != 0 &&
              ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 != 0 ||
               (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 != 0)))))) {
            pxVar3 = xmlNodeGetContent(p_Stack_38);
            if (pxVar3 != (xmlChar *)0x0) {
              p_Var4 = (_xmlNode *)xmlDictLookup((xmlDictPtr)doc->parent,pxVar3,-1);
              doc->next = p_Var4;
              (*xmlFree)(pxVar3);
            }
            p_Stack_38 = p_Stack_38->next;
            while ((p_Stack_38 != (_xmlNode *)0x0 &&
                   (((p_Stack_38->type != XML_ELEMENT_NODE || (p_Stack_38->ns == (xmlNs *)0x0)) ||
                    ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 == 0 &&
                     (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 == 0))))))
                  ) {
              p_Stack_38 = p_Stack_38->next;
            }
          }
          while( true ) {
            bVar5 = false;
            if (((p_Stack_38 != (xmlNode *)0x0) &&
                (bVar5 = false, p_Stack_38->type == XML_ELEMENT_NODE)) &&
               (bVar5 = false, p_Stack_38->ns != (xmlNs *)0x0)) {
              iVar2 = xmlStrEqual(p_Stack_38->name,"ns");
              bVar5 = false;
              if (iVar2 != 0) {
                iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs);
                bVar5 = true;
                if (iVar2 == 0) {
                  iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs);
                  bVar5 = iVar2 != 0;
                }
              }
            }
            if (!bVar5) break;
            pxVar3 = xmlGetNoNsProp(p_Stack_38,"prefix");
            ns_uri = xmlGetNoNsProp(p_Stack_38,"uri");
            if ((ns_uri == (xmlChar *)0x0) || (*ns_uri == '\0')) {
              xmlSchematronPErr(ctxt,p_Stack_38,0x6df,"ns element has no uri",(xmlChar *)0x0,
                                (xmlChar *)0x0);
            }
            if ((pxVar3 == (xmlChar *)0x0) || (*pxVar3 == '\0')) {
              xmlSchematronPErr(ctxt,p_Stack_38,0x6df,"ns element has no prefix",(xmlChar *)0x0,
                                (xmlChar *)0x0);
            }
            if ((pxVar3 != (xmlChar *)0x0) && (ns_uri != (xmlChar *)0x0)) {
              xmlXPathRegisterNs(ctxt->xctxt,pxVar3,ns_uri);
              xmlSchematronAddNamespace(ctxt,pxVar3,ns_uri);
              *(int *)&doc->prev = *(int *)&doc->prev + 1;
            }
            if (ns_uri != (xmlChar *)0x0) {
              (*xmlFree)(ns_uri);
            }
            if (pxVar3 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar3);
            }
            p_Stack_38 = p_Stack_38->next;
            while ((p_Stack_38 != (_xmlNode *)0x0 &&
                   (((p_Stack_38->type != XML_ELEMENT_NODE || (p_Stack_38->ns == (xmlNs *)0x0)) ||
                    ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 == 0 &&
                     (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 == 0))))))
                  ) {
              p_Stack_38 = p_Stack_38->next;
            }
          }
          while (p_Stack_38 != (xmlNodePtr)0x0) {
            if ((((p_Stack_38 == (xmlNodePtr)0x0) || (p_Stack_38->type != XML_ELEMENT_NODE)) ||
                ((p_Stack_38->ns == (xmlNs *)0x0 ||
                 (iVar2 = xmlStrEqual(p_Stack_38->name,"pattern"), iVar2 == 0)))) ||
               ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 == 0 &&
                (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 == 0)))) {
              xmlSchematronPErr(ctxt,p_Stack_38,0x6df,"Expecting a pattern element instead of %s",
                                p_Stack_38->name,(xmlChar *)0x0);
            }
            else {
              xmlSchematronParsePattern(ctxt,p_Stack_38);
              *(int *)((long)&doc->prev + 4) = *(int *)((long)&doc->prev + 4) + 1;
            }
            p_Stack_38 = p_Stack_38->next;
            while ((p_Stack_38 != (_xmlNode *)0x0 &&
                   (((p_Stack_38->type != XML_ELEMENT_NODE || (p_Stack_38->ns == (xmlNs *)0x0)) ||
                    ((iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlSchematronNs), iVar2 == 0 &&
                     (iVar2 = xmlStrEqual(p_Stack_38->ns->href,xmlOldSchematronNs), iVar2 == 0))))))
                  ) {
              p_Stack_38 = p_Stack_38->next;
            }
          }
          if (*(int *)((long)&doc->prev + 4) == 0) {
            xmlSchematronPErr(ctxt,node,0x6df,"The schematron document \'%s\' has no pattern",
                              ctxt->URL,(xmlChar *)0x0);
          }
          else {
            doc->name = (char *)root;
            if (bVar1) {
              doc->type = XML_ELEMENT_NODE;
            }
            bVar1 = true;
          }
        }
      }
      if (!bVar1) {
        xmlFreeDoc((xmlDocPtr)root);
      }
      if (doc != (xmlDocPtr)0x0) {
        if (ctxt->nberrors == 0) {
          doc->extSubset = (_xmlDtd *)ctxt->namespaces;
          *(int *)&doc->intSubset = ctxt->nbNamespaces;
          ctxt->namespaces = (xmlChar **)0x0;
        }
        else {
          xmlSchematronFree((xmlSchematronPtr)doc);
          doc = (xmlDocPtr)0x0;
        }
      }
      ctxt_local = (xmlSchematronParserCtxtPtr)doc;
    }
  }
  return (xmlSchematronPtr)ctxt_local;
}

Assistant:

xmlSchematronPtr
xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)
{
    xmlSchematronPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root, cur;
    int preserve = 0;

    if (ctxt == NULL)
        return (NULL);

    ctxt->nberrors = 0;

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlReadFile((const char *) ctxt->URL, NULL,
	                  SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_LOAD,
                          "xmlSchematronParse: could not load '%s'.\n",
                          ctxt->URL, NULL);
            return (NULL);
        }
	ctxt->preserve = 0;
    } else if (ctxt->buffer != NULL) {
        doc = xmlReadMemory(ctxt->buffer, ctxt->size, NULL, NULL,
	                    SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_PARSE,
                          "xmlSchematronParse: could not parse.\n",
                          NULL, NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlDictLookup(ctxt->dict, BAD_CAST "in_memory_buffer", -1);
	ctxt->preserve = 0;
    } else if (ctxt->doc != NULL) {
        doc = ctxt->doc;
	preserve = 1;
	ctxt->preserve = 1;
    } else {
	xmlSchematronPErr(ctxt, NULL,
		      XML_SCHEMAP_NOTHING_TO_PARSE,
		      "xmlSchematronParse: could not parse.\n",
		      NULL, NULL);
        return (NULL);
    }

    /*
     * Then extract the root and Schematron parse it
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
	xmlSchematronPErr(ctxt, (xmlNodePtr) doc,
		      XML_SCHEMAP_NOROOT,
		      "The schema has no document element.\n", NULL, NULL);
	if (!preserve) {
	    xmlFreeDoc(doc);
	}
        return (NULL);
    }

    if (!IS_SCHEMATRON(root, "schema")) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The XML document '%s' is not a XML schematron document",
	    ctxt->URL, NULL);
	goto exit;
    }
    ret = xmlSchematronNewSchematron(ctxt);
    if (ret == NULL)
        goto exit;
    ctxt->schema = ret;

    /*
     * scan the schema elements
     */
    cur = root->children;
    NEXT_SCHEMATRON(cur);
    if (IS_SCHEMATRON(cur, "title")) {
        xmlChar *title = xmlNodeGetContent(cur);
	if (title != NULL) {
	    ret->title = xmlDictLookup(ret->dict, title, -1);
	    xmlFree(title);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (IS_SCHEMATRON(cur, "ns")) {
        xmlChar *prefix = xmlGetNoNsProp(cur, BAD_CAST "prefix");
        xmlChar *uri = xmlGetNoNsProp(cur, BAD_CAST "uri");
	if ((uri == NULL) || (uri[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no uri", NULL, NULL);
	}
	if ((prefix == NULL) || (prefix[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no prefix", NULL, NULL);
	}
	if ((prefix) && (uri)) {
	    xmlXPathRegisterNs(ctxt->xctxt, prefix, uri);
	    xmlSchematronAddNamespace(ctxt, prefix, uri);
	    ret->nbNs++;
	}
	if (uri)
	    xmlFree(uri);
	if (prefix)
	    xmlFree(prefix);
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (cur != NULL) {
	if (IS_SCHEMATRON(cur, "pattern")) {
	    xmlSchematronParsePattern(ctxt, cur);
	    ret->nbPattern++;
	} else {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"Expecting a pattern element instead of %s", cur->name, NULL);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    if (ret->nbPattern == 0) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The schematron document '%s' has no pattern",
	    ctxt->URL, NULL);
	goto exit;
    }
    /* the original document must be kept for reporting */
    ret->doc = doc;
    if (preserve) {
	    ret->preserve = 1;
    }
    preserve = 1;

exit:
    if (!preserve) {
	xmlFreeDoc(doc);
    }
    if (ret != NULL) {
	if (ctxt->nberrors != 0) {
	    xmlSchematronFree(ret);
	    ret = NULL;
	} else {
	    ret->namespaces = ctxt->namespaces;
	    ret->nbNamespaces = ctxt->nbNamespaces;
	    ctxt->namespaces = NULL;
	}
    }
    return (ret);
}